

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O1

pair<unsigned_long,_robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::InsertionState>
 __thiscall
robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>::
insertKeyPrepareEmptySpot<char_const&>
          (Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>> *this,
          char *key)

{
  byte *pbVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  bool bVar5;
  bool bVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  char *pcVar12;
  size_t unaff_R12;
  ulong unaff_R15;
  pair<unsigned_long,_robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::InsertionState>
  pVar13;
  
  iVar11 = 0;
  do {
    cVar2 = *key;
    uVar7 = ((ulong)(long)cVar2 >> 0x21 ^ (long)cVar2) * -0xae502812aa7333;
    uVar7 = (uVar7 >> 0x21 ^ uVar7) * *(long *)this;
    uVar7 = uVar7 >> 0x21 ^ uVar7;
    iVar4 = *(int *)(this + 0x30);
    uVar10 = ((uint)uVar7 & 0x1f) >> ((ulong)(byte)this[0x34] & 0x3f);
    uVar7 = uVar7 >> 5 & *(ulong *)(this + 0x20);
    lVar8 = *(long *)(this + 0x10);
    bVar3 = *(byte *)(lVar8 + uVar7);
    while (uVar10 = uVar10 + iVar4, uVar10 < bVar3) {
      pbVar1 = (byte *)(lVar8 + 1 + uVar7);
      uVar7 = uVar7 + 1;
      bVar3 = *pbVar1;
    }
    if (uVar10 == *(byte *)(lVar8 + uVar7)) {
      pcVar12 = (char *)(uVar7 * 0x10 + *(long *)(this + 8));
      do {
        if (cVar2 == *pcVar12) {
          unaff_R15 = 1;
          unaff_R12 = uVar7;
          goto LAB_0010f656;
        }
        uVar10 = uVar10 + iVar4;
        pbVar1 = (byte *)(lVar8 + 1 + uVar7);
        uVar7 = uVar7 + 1;
        pcVar12 = pcVar12 + 0x10;
      } while (uVar10 == *pbVar1);
    }
    if (*(ulong *)(this + 0x18) < *(ulong *)(this + 0x28)) {
      if (0xff < iVar4 + uVar10) {
        *(undefined8 *)(this + 0x28) = 0;
      }
      lVar9 = 1;
      do {
        lVar9 = lVar9 + -1;
        pcVar12 = (char *)(lVar8 + uVar7);
        lVar8 = lVar8 + 1;
      } while (*pcVar12 != '\0');
      if (lVar9 == 0) {
        unaff_R15 = 2;
      }
      else {
        Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::shiftUp
                  ((Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>
                    *)this,uVar7 - lVar9,uVar7);
        unaff_R15 = 3;
      }
      *(char *)(*(long *)(this + 0x10) + uVar7) = (char)uVar10;
      *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
      unaff_R12 = uVar7;
LAB_0010f656:
      bVar5 = false;
    }
    else {
      bVar6 = Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::
              increase_size((Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>
                             *)this);
      bVar5 = true;
      if (!bVar6) {
        bVar5 = false;
        unaff_R12 = 0;
        unaff_R15 = 0;
      }
    }
    if (!bVar5) goto LAB_0010f6a8;
    iVar11 = iVar11 + 1;
  } while (iVar11 != 0x100);
  unaff_R15 = 0;
  unaff_R12 = 0;
LAB_0010f6a8:
  pVar13._8_8_ = unaff_R15 & 0xffffffff;
  pVar13.first = unaff_R12;
  return pVar13;
}

Assistant:

std::pair<size_t, InsertionState> insertKeyPrepareEmptySpot(OtherKey&& key) {
        for (int i = 0; i < 256; ++i) {
            size_t idx{};
            InfoType info{};
            keyToIdx(key, &idx, &info);
            nextWhileLess(&info, &idx);

            // while we potentially have a match
            while (info == mInfo[idx]) {
                if (WKeyEqual::operator()(key, mKeyVals[idx].getFirst())) {
                    // key already exists, do NOT insert.
                    // see http://en.cppreference.com/w/cpp/container/unordered_map/insert
                    return std::make_pair(idx, InsertionState::key_found);
                }
                next(&info, &idx);
            }

            // unlikely that this evaluates to true
            if (ROBIN_HOOD_UNLIKELY(mNumElements >= mMaxNumElementsAllowed)) {
                if (!increase_size()) {
                    return std::make_pair(size_t(0), InsertionState::overflow_error);
                }
                continue;
            }

            // key not found, so we are now exactly where we want to insert it.
            auto const insertion_idx = idx;
            auto const insertion_info = info;
            if (ROBIN_HOOD_UNLIKELY(insertion_info + mInfoInc > 0xFF)) {
                mMaxNumElementsAllowed = 0;
            }

            // find an empty spot
            while (0 != mInfo[idx]) {
                next(&info, &idx);
            }

            if (idx != insertion_idx) {
                shiftUp(idx, insertion_idx);
            }
            // put at empty spot
            mInfo[insertion_idx] = static_cast<uint8_t>(insertion_info);
            ++mNumElements;
            return std::make_pair(insertion_idx, idx == insertion_idx
                                                     ? InsertionState::new_node
                                                     : InsertionState::overwrite_node);
        }

        // enough attempts failed, so finally give up.
        return std::make_pair(size_t(0), InsertionState::overflow_error);
    }